

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Buffers::FunctionalTest::CheckTransformFeedbackResult
          (FunctionalTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *pTVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  MessageBuilder local_360;
  MessageBuilder local_1d0;
  uint local_4c;
  int local_48;
  GLuint i;
  GLint output_data [7];
  Functions *gl;
  FunctionalTest *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  memset(&local_48,0,0x1c);
  (*this->m_pGetNamedBufferSubData)(this->m_bo_out,0,0x1c,&local_48);
  iVar1 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (iVar1 == 0) {
    for (local_4c = 0; local_4c < 7; local_4c = local_4c + 1) {
      if (*(int *)(s_expected_data + (ulong)local_4c * 4) != (&local_48)[local_4c]) {
        pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar4 = tcu::TestContext::getLog(pTVar3);
        tcu::TestLog::operator<<(&local_1d0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_1d0,(char (*) [39])"Expected data is not equal to results.");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1d0);
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    tcu::TestLog::operator<<(&local_360,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_360,(char (*) [34])"GetNamedBufferSubData has failed.");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_360);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FunctionalTest::CheckTransformFeedbackResult()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Local data storage. */
	glw::GLint output_data[sizeof(s_initial_data_b) / sizeof(s_initial_data_b[0])] = {};

	/* Fetch data. */
	m_pGetNamedBufferSubData(m_bo_out, 0, sizeof(output_data), output_data);

	/* Error checking. */
	if (GL_NO_ERROR == gl.getError())
	{
		for (glw::GLuint i = 0; i < sizeof(s_initial_data_b) / sizeof(s_initial_data_b[0]); ++i)
		{
			if (s_expected_data[i] != output_data[i])
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Expected data is not equal to results."
													<< tcu::TestLog::EndMessage;
				return false;
			}
		}

		return true;
	}
	else
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "GetNamedBufferSubData has failed."
											<< tcu::TestLog::EndMessage;
	}
	return false;
}